

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryDiv<FadCst<int>,_Fad<Fad<double>_>_>::val
          (value_type *__return_storage_ptr__,FadBinaryDiv<FadCst<int>,_Fad<Fad<double>_>_> *this)

{
  FadExpr<FadBinaryDiv<FadCst<int>,_Fad<double>_>_> local_20;
  
  local_20.fadexpr_.left_.defaultVal = 0;
  local_20.fadexpr_.left_.constant_ = (this->left_).constant_;
  local_20.fadexpr_.right_ = &this->right_->val_;
  Fad<double>::Fad<FadBinaryDiv<FadCst<int>,Fad<double>>>(__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() / right_.val();}